

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O0

int do_callout(heapframe *F,match_block_16 *mb,size_t *lengthptr)

{
  pcre2_callout_block_16 *ppVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *psVar4;
  uint local_54;
  pcre2_callout_block_16 *cb;
  size_t *callout_ovector;
  size_t save1;
  size_t save0;
  int rc;
  size_t *lengthptr_local;
  match_block_16 *mb_local;
  heapframe *F_local;
  
  if (*F->ecode == 0x76) {
    local_54 = 4;
  }
  else {
    local_54 = (uint)F->ecode[3];
  }
  *lengthptr = (long)(int)local_54;
  if (mb->callout == (_func_int_pcre2_callout_block_16_ptr_void_ptr *)0x0) {
    F_local._4_4_ = 0;
  }
  else {
    psVar4 = &F->last_group_offset;
    ppVar1 = mb->cb;
    ppVar1->capture_top = ((uint)(F->offset_top >> 1) & 0x7fffffff) + 1;
    ppVar1->capture_last = F->capture_last;
    ppVar1->offset_vector = psVar4;
    ppVar1->mark = mb->nomatch_mark;
    ppVar1->current_position = (long)F->eptr - (long)mb->start_subject >> 1;
    ppVar1->pattern_position = (ulong)F->ecode[1];
    ppVar1->next_item_length = (ulong)F->ecode[2];
    if (*F->ecode == 0x76) {
      ppVar1->callout_number = (uint)F->ecode[3];
      ppVar1->callout_string_offset = 0;
      ppVar1->callout_string = (PCRE2_SPTR16)0x0;
      ppVar1->callout_string_length = 0;
    }
    else {
      ppVar1->callout_number = 0;
      ppVar1->callout_string_offset = (ulong)F->ecode[4];
      ppVar1->callout_string = F->ecode + 6;
      ppVar1->callout_string_length = *lengthptr - 7;
    }
    sVar2 = *psVar4;
    sVar3 = F->offset_top;
    F->offset_top = 0xffffffffffffffff;
    *psVar4 = 0xffffffffffffffff;
    F_local._4_4_ = (*mb->callout)(ppVar1,mb->callout_data);
    *psVar4 = sVar2;
    F->offset_top = sVar3;
    ppVar1->callout_flags = 0;
  }
  return F_local._4_4_;
}

Assistant:

static int
do_callout(heapframe *F, match_block *mb, PCRE2_SIZE *lengthptr)
{
int rc;
PCRE2_SIZE save0, save1;
PCRE2_SIZE *callout_ovector;
pcre2_callout_block *cb;

*lengthptr = (*Fecode == OP_CALLOUT)?
  PRIV(OP_lengths)[OP_CALLOUT] : GET(Fecode, 1 + 2*LINK_SIZE);

if (mb->callout == NULL) return 0;   /* No callout function provided */

/* The original matching code (pre 10.30) worked directly with the ovector
passed by the user, and this was passed to callouts. Now that the working
ovector is in the backtracking frame, it no longer needs to reserve space for
the overall match offsets (which would waste space in the frame). For backward
compatibility, however, we pass capture_top and offset_vector to the callout as
if for the extended ovector, and we ensure that the first two slots are unset
by preserving and restoring their current contents. Picky compilers complain if
references such as Fovector[-2] are use directly, so we set up a separate
pointer. */

callout_ovector = (PCRE2_SIZE *)(Fovector) - 2;

/* The cb->version, cb->subject, cb->subject_length, and cb->start_match fields
are set externally. The first 3 never change; the last is updated for each
bumpalong. */

cb = mb->cb;
cb->capture_top      = (uint32_t)Foffset_top/2 + 1;
cb->capture_last     = Fcapture_last;
cb->offset_vector    = callout_ovector;
cb->mark             = mb->nomatch_mark;
cb->current_position = (PCRE2_SIZE)(Feptr - mb->start_subject);
cb->pattern_position = GET(Fecode, 1);
cb->next_item_length = GET(Fecode, 1 + LINK_SIZE);

if (*Fecode == OP_CALLOUT)  /* Numerical callout */
  {
  cb->callout_number = Fecode[1 + 2*LINK_SIZE];
  cb->callout_string_offset = 0;
  cb->callout_string = NULL;
  cb->callout_string_length = 0;
  }
else  /* String callout */
  {
  cb->callout_number = 0;
  cb->callout_string_offset = GET(Fecode, 1 + 3*LINK_SIZE);
  cb->callout_string = Fecode + (1 + 4*LINK_SIZE) + 1;
  cb->callout_string_length =
    *lengthptr - (1 + 4*LINK_SIZE) - 2;
  }

save0 = callout_ovector[0];
save1 = callout_ovector[1];
callout_ovector[0] = callout_ovector[1] = PCRE2_UNSET;
rc = mb->callout(cb, mb->callout_data);
callout_ovector[0] = save0;
callout_ovector[1] = save1;
cb->callout_flags = 0;
return rc;
}